

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

bool __thiscall Memory::HeapInfo::HasZeroQueuedPages(HeapInfo *this)

{
  anon_class_8_1_8889d644 local_30;
  bool local_21 [8];
  bool hasZeroQueuedPage;
  
  local_30.hasZeroQueuedPage = local_21;
  local_21[0] = false;
  HasZeroQueuedPages::anon_class_8_1_8889d644::operator()
            (&local_30,&(this->recyclerPageAllocator).super_IdleDecommitPageAllocator);
  HasZeroQueuedPages::anon_class_8_1_8889d644::operator()
            (&local_30,&(this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator);
  HasZeroQueuedPages::anon_class_8_1_8889d644::operator()
            (&local_30,&(this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator);
  return local_21[0];
}

Assistant:

bool HeapInfo::HasZeroQueuedPages()
{
    bool hasZeroQueuedPage = false;
    ForEachNonLeafPageAllocator([&](IdleDecommitPageAllocator * pageAlloc)
    {
        hasZeroQueuedPage = hasZeroQueuedPage || pageAlloc->HasZeroQueuedPages();
    });
    return hasZeroQueuedPage;
}